

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

void anon_unknown.dwarf_bedbfc::get_cpu_times(cpu_times *current)

{
  int local_9c;
  undefined8 local_98;
  int_least64_t local_90;
  int_least64_t factor;
  undefined8 local_80;
  long local_78;
  undefined8 local_70;
  int local_64;
  undefined8 local_60;
  clock_t local_58;
  clock_t c;
  tms tm;
  undefined8 local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  nanoseconds x;
  cpu_times *current_local;
  
  x.__r = (rep)current;
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_20);
  tm.tms_cstime = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_18);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_28,&tm.tms_cstime);
  *(undefined8 *)x.__r = local_28;
  local_58 = times((tms *)&c);
  if (local_58 == -1) {
    local_64 = -1;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_60,&local_64);
    *(undefined8 *)(x.__r + 8) = local_60;
    *(undefined8 *)(x.__r + 0x10) = *(undefined8 *)(x.__r + 8);
  }
  else {
    local_78 = tm.tms_utime + tm.tms_cutime;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_70,&local_78);
    *(undefined8 *)(x.__r + 0x10) = local_70;
    factor = c + tm.tms_stime;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_80,&factor);
    *(undefined8 *)(x.__r + 8) = local_80;
    local_90 = tick_factor();
    if (local_90 == -1) {
      local_9c = -1;
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_98,&local_9c);
      *(undefined8 *)(x.__r + 0x10) = local_98;
      *(undefined8 *)(x.__r + 8) = *(undefined8 *)(x.__r + 0x10);
    }
    else {
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator*=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)(x.__r + 8),&local_90);
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator*=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)(x.__r + 0x10),&local_90);
    }
  }
  return;
}

Assistant:

void get_cpu_times(lf::base::Timer::cpu_times* const current) {
  const std::chrono::nanoseconds x(
      std::chrono::high_resolution_clock::now().time_since_epoch());
  current->wall = std::chrono::nanoseconds(x.count());

#if defined(_WIN32) || defined(WIN32)

  FILETIME creation, exit;
  if (::GetProcessTimes(::GetCurrentProcess(), &creation, &exit,
                        (LPFILETIME)&current->system,
                        (LPFILETIME)&current->user)) {
    current->user *= 100;  // Windows uses 100 nanosecond ticks
    current->system *= 100;
  } else

  {
    current->system = current->user = std::chrono::nanoseconds(-1);
  }
#else
  tms tm;  // NOLINT
  const clock_t c = ::times(&tm);
  if (c == static_cast<clock_t>(-1))  // error
  {
    current->system = current->user = std::chrono::nanoseconds(-1);
  } else {
    current->system = std::chrono::nanoseconds(tm.tms_stime + tm.tms_cstime);
    current->user = std::chrono::nanoseconds(tm.tms_utime + tm.tms_cutime);
    int_least64_t factor;
    if (factor = tick_factor(); factor != -1) {
      current->user *= factor;
      current->system *= factor;
    } else {
      current->user = current->system = std::chrono::nanoseconds(-1);
    }
  }
#endif
}